

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O2

void __thiscall QDeviceDiscoveryUDev::handleUDevNotification(QDeviceDiscoveryUDev *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  udev_device *dev;
  char *pcVar7;
  udev_device *dev_00;
  char *pcVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QByteArrayView local_78;
  QArrayDataPointer<char16_t> local_68;
  char *local_50;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x20) == 0) goto LAB_00137b43;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  dev = (udev_device *)udev_monitor_receive_device();
  if (dev != (udev_device *)0x0) {
    pcVar7 = (char *)udev_device_get_action(dev);
    if (pcVar7 != (char *)0x0) {
      local_50 = (char *)udev_device_get_devnode(dev);
      if (local_50 != (char *)0x0) {
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_78,&local_50);
        QVar9.m_data = (storage_type *)local_78.m_size;
        QVar9.m_size = (qsizetype)&local_68;
        QString::fromUtf8(QVar9);
        qVar3 = local_48.size;
        pcVar2 = local_48.ptr;
        pDVar1 = local_48.d;
        local_48.d = local_68.d;
        local_48.ptr = local_68.ptr;
        local_68.d = pDVar1;
        local_68.ptr = pcVar2;
        local_48.size = local_68.size;
        local_68.size = qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        QVar10.m_data = (char *)0x10;
        QVar10.m_size = (qsizetype)&local_48;
        cVar4 = QString::startsWith(QVar10,0x13eb2b);
        if (cVar4 == '\0') {
          QVar11.m_data = (char *)0xd;
          QVar11.m_size = (qsizetype)&local_48;
          cVar4 = QString::startsWith(QVar11,0x13eb3c);
          if (cVar4 == '\0') goto LAB_00137b31;
          pcVar8 = "drm";
        }
        else {
          pcVar8 = "input";
        }
        bVar5 = checkDeviceType(this,dev);
        if (bVar5) {
LAB_00137af1:
          iVar6 = qstrcmp(pcVar7,"add");
          if (iVar6 == 0) {
            QDeviceDiscovery::deviceDetected((QDeviceDiscovery *)this,(QString *)&local_48);
          }
          iVar6 = qstrcmp(pcVar7,"remove");
          if (iVar6 == 0) {
            QDeviceDiscovery::deviceRemoved((QDeviceDiscovery *)this,(QString *)&local_48);
          }
        }
        else {
          dev_00 = (udev_device *)udev_device_get_parent_with_subsystem_devtype(dev,pcVar8,0);
          if (dev_00 != (udev_device *)0x0) {
            bVar5 = checkDeviceType(this,dev_00);
            if (bVar5) goto LAB_00137af1;
          }
        }
      }
    }
  }
LAB_00137b31:
  udev_device_unref(dev);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
LAB_00137b43:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDeviceDiscoveryUDev::handleUDevNotification()
{
    if (!m_udevMonitor)
        return;

    struct udev_device *dev;
    QString devNode;

    dev = udev_monitor_receive_device(m_udevMonitor);
    if (!dev)
        goto cleanup;

    const char *action;
    action = udev_device_get_action(dev);
    if (!action)
        goto cleanup;

    const char *str;
    str = udev_device_get_devnode(dev);
    if (!str)
        goto cleanup;

    const char *subsystem;
    devNode = QString::fromUtf8(str);
    if (devNode.startsWith(QT_EVDEV_DEVICE ""_L1))
        subsystem = "input";
    else if (devNode.startsWith(QT_DRM_DEVICE ""_L1))
        subsystem = "drm";
    else goto cleanup;

    // if we cannot determine a type, walk up the device tree
    if (!checkDeviceType(dev)) {
        // does not increase the refcount
        struct udev_device *parent_dev = udev_device_get_parent_with_subsystem_devtype(dev, subsystem, 0);
        if (!parent_dev)
            goto cleanup;

        if (!checkDeviceType(parent_dev))
            goto cleanup;
    }

    if (qstrcmp(action, "add") == 0)
        emit deviceDetected(devNode);

    if (qstrcmp(action, "remove") == 0)
        emit deviceRemoved(devNode);

cleanup:
    udev_device_unref(dev);
}